

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O3

void __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::SListIntermediateNode::NodePtrComparator>
::remove<Kernel::TermList::Top>
          (SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::SListIntermediateNode::NodePtrComparator>
           *this,Top key)

{
  Node *pNVar1;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:647:37),_Constant<0>_>
  RVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  Node *pNVar6;
  uint uVar7;
  byte bVar8;
  Node *pNVar9;
  ulong uVar10;
  Node *pNVar11;
  anon_class_16_2_441c8d4f f;
  anon_class_16_2_441c8d4f f_00;
  Top TVar12;
  Coproduct<Kernel::VarNumber,_Kernel::SymbolId> local_50;
  undefined8 local_40;
  char local_38;
  
  local_40 = key._inner._inner._0_8_;
  local_38 = key._inner._inner._content[7];
  uVar7 = this->_top - 1;
  pNVar6 = this->_left;
LAB_0032e4b0:
  do {
    pNVar11 = pNVar6;
    uVar4 = (ulong)uVar7;
    while (pNVar6 = pNVar11->nodes[uVar4], pNVar6 != (Node *)0x0) {
      TVar12 = Kernel::TermList::top(&pNVar6->value->_term);
      local_50._inner._0_8_ = TVar12._inner._inner._0_8_;
      bVar8 = TVar12._inner._inner._0_1_ & 1;
      local_50._inner._content[7] = TVar12._inner._inner._content[7];
      if (((byte)local_40._0_1_ & 1) == bVar8) {
        f.rhs = &local_50;
        f.lhs = (Coproduct<Kernel::VarNumber,_Kernel::SymbolId> *)&local_40;
        RVar2 = CoproductImpl::RawCoproduct<Kernel::VarNumber,Kernel::SymbolId>::operator()
                          ((RawCoproduct<Kernel::VarNumber,Kernel::SymbolId> *)&local_40,f);
      }
      else {
        RVar2 = -(uint)(((byte)local_40._0_1_ & 1) < bVar8) | GREATER;
      }
      if (RVar2 == LESS) break;
      if (RVar2 == GREATER) goto LAB_0032e4b0;
      if (RVar2 == EQUAL) {
        pNVar1 = pNVar6->nodes[0];
        pNVar9 = pNVar6;
        if (uVar7 == 0) {
          pNVar11->nodes[0] = pNVar1;
          goto LAB_0032e5da;
        }
        if ((pNVar1 != (Node *)0x0) && (pNVar6->nodes[uVar4] != pNVar1)) {
          TVar12 = Kernel::TermList::top(&pNVar1->value->_term);
          local_50._inner._0_8_ = TVar12._inner._inner._0_8_;
          local_50._inner._content[7] = TVar12._inner._inner._content[7];
          if ((((TVar12._inner._inner._0_1_ ^ (byte)local_40._0_1_) & 1) == 0) &&
             (f_00.rhs = &local_50,
             f_00.lhs = (Coproduct<Kernel::VarNumber,_Kernel::SymbolId> *)&local_40,
             RVar2 = CoproductImpl::RawCoproduct<Kernel::VarNumber,Kernel::SymbolId>::operator()
                               ((RawCoproduct<Kernel::VarNumber,Kernel::SymbolId> *)&local_40,f_00),
             RVar2 == EQUAL)) {
            pNVar9 = pNVar6->nodes[0];
            uVar7 = 0xffffffff;
            do {
              uVar5 = uVar7 + 2;
              uVar7 = uVar7 + 1;
            } while (pNVar9 == pNVar6->nodes[uVar5]);
            uVar4 = (ulong)uVar7;
            pNVar6->nodes[uVar4] = pNVar9->nodes[uVar4];
            pNVar11 = pNVar6;
            uVar10 = uVar4;
            if (uVar7 != 0) {
LAB_0032e57a:
              do {
                uVar3 = uVar4 - 1;
                do {
                  pNVar6 = pNVar11;
                  pNVar11 = pNVar6->nodes[uVar4 - 1];
                } while (pNVar6->nodes[uVar4 - 1] != pNVar9);
                pNVar6->nodes[uVar4 - 1] = pNVar9->nodes[uVar4 - 1];
                uVar4 = uVar3;
                pNVar11 = pNVar6;
              } while (uVar3 != 0);
              uVar4 = uVar10 * 8 + 0x1f & 0xffffffff0;
              if (uVar4 == 0) {
                pNVar9->value = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pNVar9;
                return;
              }
              if (0x10 < uVar4) {
                if (uVar4 < 0x19) {
                  pNVar9->value = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
                  GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pNVar9;
                  return;
                }
                if (uVar4 < 0x21) {
                  pNVar9->value = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
                  GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pNVar9;
                  return;
                }
                if (uVar4 < 0x31) {
                  pNVar9->value = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
                  GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pNVar9;
                  return;
                }
                if (uVar4 < 0x41) {
                  pNVar9->value = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
                  GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pNVar9;
                  return;
                }
                operator_delete(pNVar9,0x10);
                return;
              }
            }
LAB_0032e5da:
            pNVar9->value = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pNVar9;
            return;
          }
        }
        pNVar11->nodes[uVar4] = pNVar6->nodes[uVar4];
        uVar10 = uVar4;
        goto LAB_0032e57a;
      }
    }
    uVar7 = uVar7 - 1;
    pNVar6 = pNVar11;
  } while( true );
}

Assistant:

void remove(Key key)
  {
    ASS(_top > 0);

    Node* found = 0; // found node
#if VDEBUG
    unsigned foundHeight = 0; // its height
#else
    unsigned foundHeight; // its height
#endif

    Node* left = _left;
    unsigned h = _top-1;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	ASS(h != 0); //this would mean that the value is not present in the list
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  ASS(h != 0);
	  h--;
	  break;

	case GREATER:
	  left = next;
	  break;

	case EQUAL:
	  found = next;
	  foundHeight = h;
	  if(h>0 && found->nodes[0] && found->nodes[h]!=found->nodes[0] &&
		  ValueComparator::compare(key,found->nodes[0]->value)==EQUAL) {
	    //The next element exists, contains the same value,
	    //and its height is lower that the height of this one.
	    //We'll rather delete that one, than the one we've found,
	    //because otherwise there'd be only low elements after a few
	    //deletions, which would degrade the skip list to linked list.
	    h=0;
	    while(found->nodes[0]==found->nodes[h+1]) {
	      h++;
	    }
	    left = found;
	    found = found->nodes[0];
	    foundHeight = h;
	  }
	  for(;;) {
	    left->nodes[h] = found->nodes[h];
	    if(h==0) {
	      break;
	    }
	    h--;
	    while(left->nodes[h]!=found) {
	      left=left->nodes[h];
	      ASS(ValueComparator::compare(key,left->value)!=LESS);
	    }
	  }

	  deallocate(found,foundHeight);
	  return;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }